

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trigonometric.hpp
# Opt level: O2

Vector4<mt::Dual<float>_> * __thiscall
mt::logLerpUnit<mt::Dual<float>,float>
          (Vector4<mt::Dual<float>_> *__return_storage_ptr__,mt *this,Vector4<mt::Dual<float>_> *u1,
          Vector4<mt::Dual<float>_> *u2,float t)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Vector3<float> VVar16;
  Vector3<float> VVar17;
  Vector4<float> q;
  undefined8 local_b8;
  float local_a8;
  float fStack_a4;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined1 local_38 [16];
  
  local_98._4_4_ = *(undefined4 *)(this + 8);
  local_98._0_4_ = *(undefined4 *)this;
  fStack_90 = (float)*(undefined4 *)(this + 0x10);
  fStack_8c = (float)*(undefined4 *)(this + 0x18);
  VVar16 = logUnit<float>((Vector4<float> *)local_98);
  fVar11 = *(float *)this;
  fVar15 = *(float *)(this + 8);
  fVar1 = *(float *)(this + 4);
  fVar2 = *(float *)(this + 0xc);
  fVar5 = *(float *)(this + 0x14);
  fVar6 = *(float *)(this + 0x1c);
  local_58 = ZEXT416(*(uint *)(this + 0x18));
  local_68._4_4_ = 0;
  local_68._0_4_ = *(uint *)(this + 0x18);
  local_68._8_4_ = *(uint *)(this + 0x10) ^ 0x80000000;
  local_68._12_4_ = 0;
  local_98._4_4_ = (u1->y).mReal;
  local_98._0_4_ = (u1->x).mReal;
  fStack_90 = (u1->z).mReal;
  fStack_8c = (u1->w).mReal;
  VVar17 = logUnit<float>((Vector4<float> *)local_98);
  local_88 = (u1->x).mReal;
  fStack_80 = (u1->y).mReal;
  fVar7 = (u1->z).mDual;
  fVar8 = (u1->w).mDual;
  fVar13 = -fStack_80;
  fVar14 = -fVar11;
  fVar15 = -fVar15;
  local_b8 = CONCAT44(fVar11,local_88) ^ 0x8000000080000000;
  local_78 = fVar13 * fVar7;
  fStack_74 = fVar8 * 0.0;
  fStack_70 = fVar15 * fVar5;
  fStack_6c = fVar6 * 0.0;
  local_88 = fVar7 * local_88;
  fStack_84 = fVar8 * (u1->x).mDual;
  fStack_80 = fVar5 * fStack_80;
  fStack_7c = fVar6 * (u1->y).mDual;
  fVar3 = (u1->x).mDual;
  fVar4 = (u1->y).mDual;
  fVar11 = (u1->w).mReal;
  fVar9 = -(u1->z).mReal;
  fVar12 = 1.0 - t;
  fVar10 = (((float)local_68._8_4_ * fVar2 + (float)local_58._0_4_ * fVar1 + fVar14 * fVar6) -
           fVar15 * fVar5) * fVar12 +
           ((fVar4 * fVar9 + fVar11 * fVar3 + (float)local_b8 * fVar8) - local_78) * t;
  local_a8 = VVar16.x;
  fStack_a4 = VVar16.y;
  local_48._0_4_ = VVar17.x;
  local_48._4_4_ = VVar17.y;
  local_38._0_4_ = t * (float)local_48 + fVar12 * local_a8;
  local_38._4_4_ = t * local_48._4_4_ + fVar12 * fStack_a4;
  fVar14 = ((fVar2 * (float)local_58._0_4_ - (float)local_68._8_4_ * fVar1) + fVar5 * fVar14 +
           fVar15 * fVar6) * fVar12 +
           (((fVar4 * fVar11 - fVar9 * fVar3) - local_88) + fVar13 * fVar8) * t;
  fVar11 = (((float)local_68._8_4_ * fVar6 - fVar2 * local_b8._4_4_) +
           fVar15 * fVar1 + fVar5 * (float)local_68._0_4_) * fVar12 +
           ((fVar9 * fVar8 - fVar4 * (float)local_b8) + fVar13 * fVar3 + fVar7 * fVar11) * t;
  local_38._8_4_ = VVar17.z * t + VVar16.z * fVar12;
  local_48 = VVar17._0_8_;
  _local_98 = (anon_struct_16_4_d86d922e_for_anon_union_16_2_77b3086c_for_Vector4<float>_1_0)
              exp<float>((Vector3<float> *)local_38);
  fVar5 = local_98._8_4_;
  fVar6 = local_98._12_4_;
  fVar7 = local_98._0_4_;
  fVar8 = local_98._4_4_;
  local_38._0_4_ = (fVar14 * fVar5 + fVar10 * fVar6) - fVar11 * fVar8;
  local_38._4_4_ = (fVar14 * fVar6 - fVar10 * fVar5) + fVar11 * fVar7;
  local_38._8_8_ =
       CONCAT44(fVar14 * fVar8 + fVar11 * fVar5 + fVar10 * fVar7,
                (fVar10 * fVar8 + fVar6 * fVar11) - fVar14 * fVar7) ^ 0x8000000000000000;
  makeDual<float>((Vector4<float> *)local_98,(Vector4<float> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Vector4<Scalar1> logLerpUnit(const Vector4<Scalar1>& u1, const Vector4<Scalar1>& u2, Scalar2 t)
    {
        return exp(lerp(logUnit(u1), logUnit(u2), t));  
    }